

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigPhase.c
# Opt level: O2

int Saig_ManPhasePrefixLength(Aig_Man_t *p,int fVerbose,int fVeryVerbose,Vec_Int_t **pvTrans)

{
  Vec_Ptr_t *p_00;
  uint nPref;
  uint uVar1;
  Saig_Tsim_t *p_01;
  uint *pState;
  Vec_Int_t *pVVar2;
  uint nLoop;
  uint nWords;
  
  if (p->nRegs == 0) {
    __assert_fail("Saig_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigPhase.c"
                  ,0x36b,"int Saig_ManPhasePrefixLength(Aig_Man_t *, int, int, Vec_Int_t **)");
  }
  if (p->nTruePis != 0) {
    if (p->nTruePos != 0) {
      nPref = 0;
      p_01 = Saig_ManReachableTernary(p,(Vec_Int_t *)0x0,0);
      if (p_01 != (Saig_Tsim_t *)0x0) {
        p_00 = p_01->vStates;
        pState = (uint *)Vec_PtrEntryLast(p_00);
        nPref = Saig_TsiComputePrefix(p_01,pState,p_01->nWords);
        nLoop = ~nPref + p_00->nSize;
        nWords = nPref;
        uVar1 = Saig_TsiCountNonXValuedRegisters(p_01,nPref);
        if (pvTrans != (Vec_Int_t **)0x0) {
          nWords = nPref;
          pVVar2 = Saig_TsiComputeTransient(p_01,nPref);
          *pvTrans = pVVar2;
        }
        if (fVerbose != 0) {
          nWords = nPref;
          printf("Lead = %5d. Loop = %5d.  Total flops = %5d. Binary flops = %5d.\n",(ulong)nPref,
                 (ulong)nLoop,(ulong)(uint)p->nRegs,(ulong)uVar1);
        }
        if (fVeryVerbose != 0) {
          Saig_TsiPrintTraces(p_01,nWords,nPref,nLoop);
        }
        Saig_TsiStop(p_01);
      }
      return nPref;
    }
    __assert_fail("Saig_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigPhase.c"
                  ,0x36d,"int Saig_ManPhasePrefixLength(Aig_Man_t *, int, int, Vec_Int_t **)");
  }
  __assert_fail("Saig_ManPiNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigPhase.c"
                ,0x36c,"int Saig_ManPhasePrefixLength(Aig_Man_t *, int, int, Vec_Int_t **)");
}

Assistant:

int Saig_ManPhasePrefixLength( Aig_Man_t * p, int fVerbose, int fVeryVerbose, Vec_Int_t ** pvTrans )
{
    Saig_Tsim_t * pTsi;
    int nFrames, nPrefix, nNonXRegs;
    assert( Saig_ManRegNum(p) );
    assert( Saig_ManPiNum(p) );
    assert( Saig_ManPoNum(p) );
    // perform terminary simulation
    pTsi = Saig_ManReachableTernary( p, NULL, 0 );
    if ( pTsi == NULL )
        return 0;
    // derive information
    nPrefix   = Saig_TsiComputePrefix( pTsi, (unsigned *)Vec_PtrEntryLast(pTsi->vStates), pTsi->nWords );
    nFrames   = Vec_PtrSize(pTsi->vStates) - 1 - nPrefix;
    nNonXRegs = Saig_TsiCountNonXValuedRegisters( pTsi, nPrefix );

    if ( pvTrans )
        *pvTrans = Saig_TsiComputeTransient( pTsi, nPrefix );

    // print statistics
    if ( fVerbose )
        printf( "Lead = %5d. Loop = %5d.  Total flops = %5d. Binary flops = %5d.\n", nPrefix, nFrames, p->nRegs, nNonXRegs );
    if ( fVeryVerbose )
        Saig_TsiPrintTraces( pTsi, pTsi->nWords, nPrefix, nFrames );
    Saig_TsiStop( pTsi );
    // potentially, may need to reduce nFrames if nPrefix is less than nFrames
    return nPrefix;
}